

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZlibReader.cpp
# Opt level: O0

bool __thiscall ZlibReader::reset_zlib(ZlibReader *this)

{
  int iVar1;
  int zresult;
  ZlibReader *this_local;
  
  if ((this->initialized & 1U) != 0) {
    inflateEnd(&this->z);
  }
  (this->z).zalloc = (alloc_func)0x0;
  (this->z).zfree = (free_func)0x0;
  (this->z).opaque = (voidpf)0x0;
  iVar1 = inflateInit_(&this->z,"1.2.11",0x70);
  this->zpos = 0;
  this->pos = 0;
  reset_crc32(this);
  return iVar1 == 0;
}

Assistant:

bool ZlibReader::reset_zlib()
{
	int zresult;

	if (initialized)
	{
		inflateEnd(&z);
	}

	z.zalloc = Z_NULL;
	z.zfree = Z_NULL;
	z.opaque = Z_NULL;
	zresult = inflateInit(&z);

	zpos = 0;
	pos = 0;

	reset_crc32();

	return (zresult == Z_OK);
}